

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::strTree<char_const(&)[3],kj::StringPtr&,char_const(&)[8],kj::String&,char_const(&)[11]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [3],StringPtr *params_1,
          char (*params_2) [8],String *params_3,char (*params_4) [11])

{
  char (*value) [3];
  StringPtr *value_00;
  char (*value_01) [8];
  String *value_02;
  char (*value_03) [11];
  StringTree *__return_storage_ptr___00;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  String *local_38;
  char (*params_local_4) [11];
  String *params_local_3;
  char (*params_local_2) [8];
  StringPtr *params_local_1;
  char (*params_local) [3];
  
  __return_storage_ptr___00 = __return_storage_ptr__;
  local_38 = params_3;
  params_local_4 = (char (*) [11])params_2;
  params_local_3 = (String *)params_1;
  params_local_2 = (char (*) [8])params;
  params_local_1 = (StringPtr *)this;
  params_local = (char (*) [3])__return_storage_ptr__;
  value = ::const((char (*) [3])this);
  local_48 = _::toStringTreeOrCharSequence<char_const(&)[3]>(value);
  value_00 = fwd<kj::StringPtr&>((StringPtr *)params_local_2);
  local_58 = _::toStringTreeOrCharSequence<kj::StringPtr&>(value_00);
  value_01 = ::const((char (*) [8])params_local_3);
  local_68 = _::toStringTreeOrCharSequence<char_const(&)[8]>(value_01);
  value_02 = fwd<kj::String&>((String *)params_local_4);
  local_78 = _::toStringTreeOrCharSequence<kj::String&>(value_02);
  value_03 = ::const((char (*) [11])local_38);
  local_88 = _::toStringTreeOrCharSequence<char_const(&)[11]>(value_03);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr___00,(StringTree *)&local_48,&local_58,&local_68,&local_78,
             &local_88,(ArrayPtr<const_char> *)__return_storage_ptr___00);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}